

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# threads.c
# Opt level: O1

void sx_mutex_init(sx_mutex *mutex)

{
  code *pcVar1;
  int iVar2;
  pthread_mutexattr_t attr;
  pthread_mutexattr_t local_14;
  
  iVar2 = pthread_mutexattr_init(&local_14);
  if (iVar2 != 0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c",
                      299,"r == 0");
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  pthread_mutexattr_settype(&local_14,1);
  iVar2 = pthread_mutex_init((pthread_mutex_t *)mutex,&local_14);
  if (iVar2 != 0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/threads.c",
                      0x12e,"pthread_mutex_init failed");
    pcVar1 = (code *)swi(3);
    (*pcVar1)();
    return;
  }
  return;
}

Assistant:

void sx_mutex_init(sx_mutex* mutex)
{
    sx__mutex* _m = (sx__mutex*)mutex->data;

    pthread_mutexattr_t attr;
    int r = pthread_mutexattr_init(&attr);
    sx_assert(r == 0);
    pthread_mutexattr_settype(&attr, PTHREAD_MUTEX_RECURSIVE);
    r = pthread_mutex_init(&_m->handle, &attr);
    sx_assertf(r == 0, "pthread_mutex_init failed");
    sx_unused(r);
}